

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzcompelpostproc.h
# Opt level: O3

TPZCompEl * __thiscall
TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeTriang>_>::Clone
          (TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeTriang>_> *this,TPZCompMesh *mesh)

{
  TPZCompElH1<pzshape::TPZShapeTriang> *this_00;
  
  this_00 = (TPZCompElH1<pzshape::TPZShapeTriang> *)operator_new(0xb0);
  *(undefined ***)
   &(this_00->super_TPZIntelGen<pzshape::TPZShapeTriang>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_01977ca0;
  TPZCompElH1<pzshape::TPZShapeTriang>::TPZCompElH1
            (this_00,&PTR_PTR_01971810,mesh,&this->super_TPZCompElH1<pzshape::TPZShapeTriang>);
  *(undefined8 *)
   &this_00[1].super_TPZIntelGen<pzshape::TPZShapeTriang>.super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = 0;
  *(undefined ***)
   &(this_00->super_TPZIntelGen<pzshape::TPZShapeTriang>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElPostProc_01971440;
  return (TPZCompEl *)this_00;
}

Assistant:

inline TPZCompEl * TPZCompElPostProc<TCOMPEL>::Clone(TPZCompMesh &mesh) const{
    return new TPZCompElPostProc<TCOMPEL> (mesh, *this);
}